

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O3

void deserialize_model<_IO_FILE*,short,unsigned_int>
               (ExtIsoForest *model,_IO_FILE **in,vector<char,_std::allocator<char>_> *buffer,
               bool diff_endian,bool lacks_range_penalty,bool lacks_scoring_metric)

{
  ushort uVar1;
  ScoringMetric SVar2;
  IsoHPlane *pIVar3;
  IsoHPlane *node;
  IsoHPlane *node_00;
  vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree;
  pointer this;
  ulong uVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> buffer_;
  size_t veclen;
  double data_doubles [2];
  size_t data_sizets [2];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_88;
  pointer local_68;
  size_type local_60;
  double local_58;
  double dStack_50;
  size_t local_48;
  size_type local_40;
  
  if (!interrupt_switch) {
    if (lacks_range_penalty) {
      read_bytes<unsigned_char>(&local_88,3,in);
      uVar1 = (ushort)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      read_bytes<unsigned_char>(&local_88,4,in);
      model->has_range_penalty =
           local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start._3_1_ != '\0';
      uVar1 = (ushort)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
    }
    uVar4 = (ulong)CONCAT14((char)(uVar1 >> 8),(uint)(uVar1 & 0xff));
    model->new_cat_action = (int)uVar4;
    model->cat_split_type = (int)(uVar4 >> 0x20);
    model->missing_action =
         (uint)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start._2_1_;
    SVar2 = Depth;
    if (!lacks_scoring_metric) {
      read_bytes<unsigned_char>(&local_88,1,in);
      SVar2 = (ScoringMetric)
              (byte)local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start;
    }
    model->scoring_metric = SVar2;
    read_bytes<double>(&local_58,2,in);
    if (diff_endian) {
      swap_endianness<double>(&local_58,2);
    }
    model->exp_avg_depth = local_58;
    model->exp_avg_sep = dStack_50;
    read_bytes<unsigned_long,unsigned_int>(&local_48,2,in,buffer,diff_endian);
    model->orig_sample_size = local_48;
    std::
    vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
    ::resize(&model->hplanes,local_40);
    local_68 = (model->hplanes).
               super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    if (local_68 !=
        (model->hplanes).
        super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      __shrink_to_fit_aux<std::vector<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>,_true>
      ::_S_do_it(&model->hplanes);
      local_68 = (model->hplanes).
                 super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    }
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    this = (model->hplanes).
           super__Vector_base<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_std::allocator<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    if (this != local_68) {
      do {
        read_bytes<unsigned_long,unsigned_int>(&local_60,1,in,buffer,diff_endian);
        std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>::resize(this,local_60);
        pIVar3 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        if (pIVar3 != (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                      super__Vector_impl_data._M_finish) {
          std::__shrink_to_fit_aux<std::vector<IsoHPlane,_std::allocator<IsoHPlane>_>,_true>::
          _S_do_it(this);
          pIVar3 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
        }
        for (node_00 = (this->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                       super__Vector_impl_data._M_start; node_00 != pIVar3; node_00 = node_00 + 1) {
          deserialize_node<_IO_FILE*,short,unsigned_int>(node_00,in,&local_88,buffer,diff_endian);
        }
        this = this + 1;
      } while (this != local_68);
      if (local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_88.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_88.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
  }
  return;
}

Assistant:

void deserialize_model(ExtIsoForest &model, itype &in, std::vector<char> &buffer,
                       const bool diff_endian, const bool lacks_range_penalty,
                       const bool lacks_scoring_metric)
{
    if (interrupt_switch) return;

    if (lacks_range_penalty)
    {
        uint8_t data_en[3];
        read_bytes<uint8_t>((void*)data_en, (size_t)3, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
    }

    else
    {
        uint8_t data_en[4];
        read_bytes<uint8_t>((void*)data_en, (size_t)4, in);
        model.new_cat_action = (NewCategAction)data_en[0];
        model.cat_split_type = (CategSplit)data_en[1];
        model.missing_action = (MissingAction)data_en[2];
        model.has_range_penalty = (bool)data_en[3];
    }

    if (lacks_scoring_metric)
    {
        model.scoring_metric = Depth;
    }

    else
    {
        uint8_t data_en;
        read_bytes<uint8_t>((void*)&data_en, (size_t)1, in);
        model.scoring_metric = (ScoringMetric)data_en;
    }

    double data_doubles[2];
    read_bytes<double, double>((void*)data_doubles, (size_t)2, in, buffer, diff_endian);
    model.exp_avg_depth = data_doubles[0];
    model.exp_avg_sep = data_doubles[1];

    size_t data_sizets[2];
    read_bytes<size_t, saved_size_t>((void*)data_sizets, (size_t)2, in, buffer, diff_endian);
    model.orig_sample_size = data_sizets[0];
    model.hplanes.resize(data_sizets[1]);
    model.hplanes.shrink_to_fit();

    size_t veclen;
    std::vector<uint8_t> buffer_;
    for (auto &tree : model.hplanes) {
        read_bytes<size_t, saved_size_t>((void*)&veclen, (size_t)1, in, buffer, diff_endian);
        tree.resize(veclen);
        tree.shrink_to_fit();
        for (auto &node : tree)
            deserialize_node<itype, saved_int_t, saved_size_t>(node, in, buffer_, buffer, diff_endian);
    }
}